

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_addScalarVec_uvec4(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  fVar1 = c->in[1].m_data[0];
  fVar2 = c->in[1].m_data[1];
  fVar3 = c->in[1].m_data[2];
  fVar4 = c->in[1].m_data[3];
  uVar6 = (uint)fVar1;
  uVar7 = (uint)fVar2;
  uVar8 = (uint)fVar3;
  uVar9 = (uint)fVar4;
  iVar5 = (int)(long)c->in[0].m_data[2];
  uVar9 = iVar5 + ((int)(fVar4 - 2.1474836e+09) & (int)uVar9 >> 0x1f | uVar9);
  uVar8 = iVar5 + ((int)(fVar3 - 2.1474836e+09) & (int)uVar8 >> 0x1f | uVar8);
  uVar7 = iVar5 + ((int)(fVar2 - 2.1474836e+09) & (int)uVar7 >> 0x1f | uVar7);
  uVar6 = iVar5 + ((int)(fVar1 - 2.1474836e+09) & (int)uVar6 >> 0x1f | uVar6);
  (c->color).m_data[0] =
       ((float)(uVar9 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(uVar9 & 0xffff | 0x4b000000);
  (c->color).m_data[1] =
       ((float)(uVar8 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(uVar8 & 0xffff | 0x4b000000);
  (c->color).m_data[2] =
       ((float)(uVar7 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(uVar7 & 0xffff | 0x4b000000);
  (c->color).m_data[3] =
       ((float)(uVar6 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(uVar6 & 0xffff | 0x4b000000);
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }